

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall
kj::_::CoroutineBase::CoroutineBase
          (CoroutineBase *this,coroutine_handle<void> coroutine,ExceptionOrValue *resultRef,
          SourceLocation location)

{
  ExceptionOrValue *resultRef_local;
  CoroutineBase *this_local;
  coroutine_handle<void> coroutine_local;
  
  PromiseNode::PromiseNode(&this->super_PromiseNode);
  Event::Event(&this->super_Event,location);
  (this->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember =
       (_func_int **)&PTR_destroy_00d9acf8;
  (this->super_Event)._vptr_Event = (_func_int **)&PTR_traceEvent_00d9ad40;
  (this->coroutine)._M_fr_ptr = coroutine._M_fr_ptr;
  this->resultRef = resultRef;
  PromiseNode::OnReadyEvent::OnReadyEvent(&this->onReadyEvent);
  this->waiting = true;
  this->hasSuspendedAtLeastOnce = false;
  Maybe<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_&>::Maybe(&this->promiseNodeForTrace);
  UnwindDetector::UnwindDetector(&this->unwindDetector);
  Maybe<kj::_::CoroutineBase::DisposalResults_&>::Maybe(&this->maybeDisposalResults);
  return;
}

Assistant:

CoroutineBase::CoroutineBase(stdcoro::coroutine_handle<> coroutine, ExceptionOrValue& resultRef,
                             SourceLocation location)
    : Event(location),
      coroutine(coroutine),
      resultRef(resultRef) {}